

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.cpp
# Opt level: O2

bool __thiscall CheckStructure::isType(CheckStructure *this,string *begin)

{
  pointer pbVar1;
  __type _Var2;
  bool bVar3;
  pointer pbVar4;
  string str;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this->m_coutTypes = this->m_coutTypes + 1;
  pbVar4 = (this->types).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->types).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar4 == pbVar1) {
      bVar3 = std::operator==(begin,"main");
      if (bVar3) {
        std::__cxx11::string::string((string *)&local_48,"missed type of main()",&local_49);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->m_errors,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        this->m_countCalls = this->m_countCalls + 1;
      }
      else {
        std::__cxx11::string::string((string *)&local_48,"Wrong type of main()",&local_49);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->m_errors,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        this->m_fWrongType = true;
      }
LAB_001031da:
      return pbVar4 != pbVar1;
    }
    std::__cxx11::string::string((string *)&local_48,(string *)pbVar4);
    _Var2 = std::operator==(begin,&local_48);
    if (_Var2) {
      if (this->m_coutTypes == 1) {
        std::__cxx11::string::_M_assign((string *)this);
      }
      std::__cxx11::string::~string((string *)&local_48);
      goto LAB_001031da;
    }
    std::__cxx11::string::~string((string *)&local_48);
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

bool CheckStructure::isType(string begin) {
    m_coutTypes++;
    for (string str : types) {
        if (begin == str) {
            if (m_coutTypes == 1)
                m_sMainType = str;
            return true;
        }
    }
    if (begin == "main") {
        m_errors.push_back("missed type of main()");
        m_countCalls++;
        return false;
    } else {
        m_errors.push_back("Wrong type of main()");
        m_fWrongType = true;
    }
    return false;
}